

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O3

ON_wString GetSortedSemicolonDelimitedString(ON_SimpleArray<ON_UUID_struct> *chan)

{
  ON_wString extraout_RAX;
  long in_RSI;
  long lVar1;
  long lVar2;
  ON_ClassArray<ON_wString> a;
  ON_ClassArray<ON_wString> local_40;
  
  ON_wString::ON_wString((ON_wString *)chan);
  local_40._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_00808f88;
  local_40.m_a = (ON_wString *)0x0;
  local_40.m_count = 0;
  local_40.m_capacity = 0;
  if (0 < *(int *)(in_RSI + 0x10)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      ON_UuidToString((ON_UUID *)(*(long *)(in_RSI + 8) + lVar1),(ON_wString *)chan);
      ON_ClassArray<ON_wString>::Append(&local_40,(ON_wString *)chan);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (lVar2 < *(int *)(in_RSI + 0x10));
    if ((local_40.m_a != (ON_wString *)0x0) && (1 < (long)local_40.m_count)) {
      ON_qsort(local_40.m_a,(long)local_40.m_count,8,ON_CompareIncreasing<ON_wString>);
    }
  }
  ON_wString::operator=((ON_wString *)chan,L"");
  if (0 < local_40.m_count) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      ON_wString::operator+=((ON_wString *)chan,(ON_wString *)((long)&(local_40.m_a)->m_s + lVar2));
      if (lVar1 < (long)local_40.m_count + -1) {
        ON_wString::operator+=((ON_wString *)chan,L";");
      }
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 8;
    } while (lVar1 < local_40.m_count);
  }
  ON_ClassArray<ON_wString>::~ON_ClassArray(&local_40);
  return (ON_wString)extraout_RAX.m_s;
}

Assistant:

static ON_wString GetSortedSemicolonDelimitedString(const ON_SimpleArray<ON_UUID>& chan)
{
  ON_wString s;

  ON_ClassArray<ON_wString> a;

  for (int i = 0; i < chan.Count(); i++)
  {
    ON_UuidToString(chan[i], s);
    a.Append(s);
  }

  a.QuickSort(ON_CompareIncreasing);

  s = L"";
  for (int i = 0; i < a.Count(); i++)
  {
    s += a[i];
    if (i < (a.Count() - 1))
      s += L";";
  }

  return s;
}